

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_dict.c
# Opt level: O0

char ** ares_htable_dict_keys(ares_htable_dict_t *htable,size_t *num)

{
  ares_htable_dict_t *arrp;
  ares_htable_t *paVar1;
  char **local_40;
  size_t i;
  char **out;
  size_t cnt;
  void **buckets;
  size_t *num_local;
  ares_htable_dict_t *htable_local;
  
  cnt = 0;
  out = (char **)0x0;
  if ((htable == (ares_htable_dict_t *)0x0) || (num == (size_t *)0x0)) {
    htable_local = (ares_htable_dict_t *)0x0;
  }
  else {
    *num = 0;
    buckets = (void **)num;
    num_local = (size_t *)htable;
    cnt = (size_t)ares_htable_all_buckets(htable->hash,(size_t *)&out);
    if (((void **)cnt == (void **)0x0) || (out == (char **)0x0)) {
      htable_local = (ares_htable_dict_t *)0x0;
    }
    else {
      arrp = (ares_htable_dict_t *)ares_malloc_zero((long)out << 3);
      if (arrp == (ares_htable_dict_t *)0x0) {
LAB_00124c0b:
        *buckets = (void *)0x0;
        ares_free_array(arrp,(size_t)out,ares_free);
        htable_local = (ares_htable_dict_t *)0x0;
      }
      else {
        for (local_40 = (char **)0x0; local_40 < out; local_40 = (char **)((long)local_40 + 1)) {
          paVar1 = (ares_htable_t *)ares_strdup((char *)**(undefined8 **)(cnt + (long)local_40 * 8))
          ;
          arrp[(long)local_40].hash = paVar1;
          if (arrp[(long)local_40].hash == (ares_htable_t *)0x0) goto LAB_00124c0b;
        }
        ares_free((void *)cnt);
        *buckets = out;
        htable_local = arrp;
      }
    }
  }
  return (char **)htable_local;
}

Assistant:

char **ares_htable_dict_keys(const ares_htable_dict_t *htable, size_t *num)
{
  const void **buckets = NULL;
  size_t       cnt     = 0;
  char       **out     = NULL;
  size_t       i;

  if (htable == NULL || num == NULL) {
    return NULL; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *num = 0;

  buckets = ares_htable_all_buckets(htable->hash, &cnt);
  if (buckets == NULL || cnt == 0) {
    return NULL;
  }

  out = ares_malloc_zero(sizeof(*out) * cnt);
  if (out == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  for (i = 0; i < cnt; i++) {
    out[i] = ares_strdup(((const ares_htable_dict_bucket_t *)buckets[i])->key);
    if (out[i] == NULL) {
      goto fail;
    }
  }

  ares_free(buckets);
  *num = cnt;
  return out;

fail:
  *num = 0;
  ares_free_array(out, cnt, ares_free);
  return NULL;
}